

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_query_result.cpp
# Opt level: O1

unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
 __thiscall duckdb::StreamQueryResult::Materialize(StreamQueryResult *this)

{
  bool bVar1;
  _Head_base<0UL,_duckdb::DataChunk_*,_false> _Var2;
  _Head_base<0UL,_duckdb::ColumnDataCollection_*,_false> _Var3;
  Allocator *allocator_p;
  ColumnDataCollection *this_00;
  pointer pCVar4;
  pointer pDVar5;
  type input;
  long *in_RSI;
  templated_unique_single_t result;
  templated_unique_single_t collection;
  ColumnDataAppendState append_state;
  _Head_base<0UL,_duckdb::DataChunk_*,_false> local_a0;
  _Head_base<0UL,_duckdb::ColumnDataCollection_*,_false> local_98;
  _Head_base<0UL,_duckdb::MaterializedQueryResult_*,_false> local_90;
  undefined1 local_88 [56];
  ColumnDataScanProperties local_50;
  vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_> local_48;
  
  if (((char)in_RSI[0x19] == '\x01') && (in_RSI[0x31] != 0)) {
    allocator_p = Allocator::DefaultAllocator();
    this_00 = (ColumnDataCollection *)operator_new(0x70);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_88,
               (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)(in_RSI + 0x13))
    ;
    ColumnDataCollection::ColumnDataCollection
              (this_00,allocator_p,(vector<duckdb::LogicalType,_true> *)local_88);
    local_98._M_head_impl = this_00;
    local_90._M_head_impl = (MaterializedQueryResult *)this;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_88);
    local_88._0_8_ = local_88 + 0x30;
    local_88._8_8_ = &DAT_00000001;
    local_88._16_8_ = (pointer)0x0;
    local_88._24_8_ = 0;
    local_88._32_4_ = 1.0;
    local_88._40_8_ = 0;
    local_88._48_8_ = (__node_base_ptr)0x0;
    local_50 = INVALID;
    local_48.
    super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pCVar4 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
             ::operator->((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                           *)&local_98);
    ColumnDataCollection::InitializeAppend(pCVar4,(ColumnDataAppendState *)local_88);
    do {
      (**(code **)(*in_RSI + 0x10))(&local_a0);
      if (local_a0._M_head_impl == (DataChunk *)0x0) {
LAB_004eb99b:
        bVar1 = false;
      }
      else {
        pDVar5 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                 operator->((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                             *)&local_a0);
        if (pDVar5->count == 0) goto LAB_004eb99b;
        pCVar4 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                 ::operator->((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                               *)&local_98);
        input = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                operator*((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                           *)&local_a0);
        bVar1 = true;
        ColumnDataCollection::Append(pCVar4,(ColumnDataAppendState *)local_88,input);
      }
      _Var2._M_head_impl = local_a0._M_head_impl;
      if (local_a0._M_head_impl != (DataChunk *)0x0) {
        DataChunk::~DataChunk(local_a0._M_head_impl);
        operator_delete(_Var2._M_head_impl);
      }
    } while (bVar1);
    make_uniq<duckdb::MaterializedQueryResult,duckdb::StatementType&,duckdb::StatementProperties&,duckdb::vector<std::__cxx11::string,true>&,duckdb::unique_ptr<duckdb::ColumnDataCollection,std::default_delete<duckdb::ColumnDataCollection>,true>,duckdb::ClientProperties&>
              ((duckdb *)&local_a0,(StatementType *)((long)in_RSI + 9),
               (StatementProperties *)(in_RSI + 2),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)(in_RSI + 0x16),
               (unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                *)&local_98,(ClientProperties *)(in_RSI + 0x2a));
    this = (StreamQueryResult *)local_90._M_head_impl;
    if ((char)in_RSI[0x19] == '\0') {
      make_uniq<duckdb::MaterializedQueryResult,duckdb::ErrorData&>
                ((duckdb *)local_90._M_head_impl,(ErrorData *)(in_RSI + 0x1a));
    }
    else {
      ((local_90._M_head_impl)->super_QueryResult).super_BaseQueryResult._vptr_BaseQueryResult =
           (_func_int **)local_a0._M_head_impl;
      local_a0._M_head_impl = (DataChunk *)0x0;
    }
    if (local_a0._M_head_impl != (DataChunk *)0x0) {
      (**(code **)&(((local_a0._M_head_impl)->data).
                    super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_start)->type)();
    }
    ::std::vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>::
    ~vector(&local_48);
    ::std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)local_88);
    _Var3._M_head_impl = local_98._M_head_impl;
    if (local_98._M_head_impl != (ColumnDataCollection *)0x0) {
      ColumnDataCollection::~ColumnDataCollection(local_98._M_head_impl);
      operator_delete(_Var3._M_head_impl);
    }
  }
  else {
    make_uniq<duckdb::MaterializedQueryResult,duckdb::ErrorData&>
              ((duckdb *)this,(ErrorData *)(in_RSI + 0x1a));
  }
  return (unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>_>
          )(__uniq_ptr_impl<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>_>
            )this;
}

Assistant:

unique_ptr<MaterializedQueryResult> StreamQueryResult::Materialize() {
	if (HasError() || !context) {
		return make_uniq<MaterializedQueryResult>(GetErrorObject());
	}
	auto collection = make_uniq<ColumnDataCollection>(Allocator::DefaultAllocator(), types);

	ColumnDataAppendState append_state;
	collection->InitializeAppend(append_state);
	while (true) {
#ifdef DUCKDB_ALTERNATIVE_VERIFY
		auto chunk = AlternativeFetch(*this);
#else
		auto chunk = Fetch();
#endif
		if (!chunk || chunk->size() == 0) {
			break;
		}
		collection->Append(append_state, *chunk);
	}
	auto result =
	    make_uniq<MaterializedQueryResult>(statement_type, properties, names, std::move(collection), client_properties);
	if (HasError()) {
		return make_uniq<MaterializedQueryResult>(GetErrorObject());
	}
	return result;
}